

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn ubxSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  ubxMsg pollMsg;
  errInfo error;
  _Bool _Var1;
  longlong lVar2;
  slReturn pvVar3;
  longlong lVar4;
  slBuffer *body;
  void *info;
  ubxMsg msg;
  ubxMsg ans;
  errorInfo_slReturn local_48;
  
  lVar2 = currentTimeMs();
  pvVar3 = flushRx(fdPort);
  _Var1 = isErrorReturn(pvVar3);
  if (_Var1) {
    createErrorInfo(&local_48,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxSynchronizer",0x491,pvVar3);
    error.fileName = local_48.fileName;
    error.cause = local_48.cause;
    error.functionName = local_48.functionName;
    error.lineNumber = local_48.lineNumber;
    error._28_4_ = local_48._28_4_;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  do {
    lVar4 = currentTimeMs();
    info = (void *)0x0;
    if (lVar2 + maxTimeMs <= lVar4) goto LAB_00108890;
    body = create_slBuffer(0,LittleEndian);
    createUbxMsg(&msg,(ubxType)0x40a,body);
    pollMsg.body = msg.body;
    pollMsg.type = msg.type;
    pollMsg._2_6_ = msg._2_6_;
    pollMsg.checksum = msg.checksum;
    pollMsg._18_6_ = msg._18_6_;
    pvVar3 = pollUbx(fdPort,pollMsg,0x4b0,&ans);
    _Var1 = isOkReturn(pvVar3);
  } while (!_Var1);
  info = (void *)0x1;
LAB_00108890:
  pvVar3 = makeOkInfoReturn(info);
  return pvVar3;
}

Assistant:

extern slReturn ubxSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        // send the request message and wait for the response...
        ubxType type = {UBX_MON, UBX_MON_VER};
        slBuffer *body = create_slBuffer(0, LittleEndian);
        ubxMsg msg = createUbxMsg(type, body);
        ubxMsg ans;
        slReturn result = pollUbx(fdPort, msg, MON_VER_SYNC_MAX_MS, &ans);
        if (isOkReturn(result))
            return makeOkInfoReturn(bool2info(true));
    }
    return makeOkInfoReturn(bool2info(false));
}